

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_environment_evaluateSymbolBinding
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  long lVar4;
  ulong uVar5;
  sysbvm_context_t *psVar6;
  long lVar7;
  sysbvm_tuple_t foundBinding;
  sysbvm_tuple_t *local_28;
  
  uVar5 = environment & 0xf;
  psVar6 = context;
  if (uVar5 == 0 && environment != 0) {
    sVar3 = *(sysbvm_tuple_t *)environment;
  }
  else if ((int)uVar5 == 0xf) {
    sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,environment >> 4);
  }
  else {
    sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
  }
  if ((sVar3 == (context->roots).functionActivationEnvironmentType) &&
     ((*(long *)(binding + 0x38) == *(long *)(environment + 0x80) ||
      (*(long *)(environment + 0x88) != 0)))) {
    uVar5 = *(ulong *)(binding + 0x40);
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      lVar7 = (long)uVar5 >> 4;
    }
    else {
      lVar7 = *(long *)(uVar5 + 0x10);
    }
    uVar5 = binding & 0xf;
    if (uVar5 == 0 && binding != 0) {
      sVar3 = *(sysbvm_tuple_t *)binding;
    }
    else if ((int)uVar5 == 0xf) {
      sVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,binding >> 4);
    }
    else {
      sVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
    }
    if (sVar3 == (context->roots).symbolArgumentBindingType) {
      uVar5 = *(ulong *)(environment + 0xa0);
    }
    else {
      if (sVar3 == (context->roots).symbolLocalBindingType) {
        uVar5 = *(ulong *)(environment + 0x90);
        uVar1 = *(ulong *)(environment + 0xa0);
        if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
          lVar4 = (long)uVar5 >> 4;
        }
        else {
          lVar4 = *(long *)(uVar5 + 0x10);
        }
        if ((uVar1 & 0xf) != 0 || uVar1 == 0) {
          return 0;
        }
        return *(sysbvm_tuple_t *)(uVar1 + 0x10 + (lVar4 + lVar7) * 8);
      }
      if (sVar3 != (context->roots).symbolCaptureBindingType) {
        abort();
      }
      uVar5 = *(ulong *)(environment + 0x98);
    }
    if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
      return *(sysbvm_tuple_t *)(uVar5 + 0x10 + lVar7 * 8);
    }
  }
  else {
    local_28 = (sysbvm_tuple_t *)0x0;
    if ((binding & 0xf) == 0 && binding != 0) {
      sVar3 = *(sysbvm_tuple_t *)(binding + 0x10);
    }
    else {
      sVar3 = 0;
    }
    _Var2 = sysbvm_environment_lookSymbolRecursively
                      (psVar6,environment,sVar3,(sysbvm_tuple_t *)&local_28);
    if (!_Var2) {
      sysbvm_error("Failed to evaluate analyzed symbol binding.");
    }
    if ((((ulong)local_28 & 0xf) != 0 || local_28 == (sysbvm_tuple_t *)0x0) ||
       (*local_28 != (context->roots).symbolValueBindingType)) {
      sysbvm_error("A value binding in the evaluation context is required.");
    }
    if ((((ulong)local_28 & 0xf) == 0 && local_28 != (sysbvm_tuple_t *)0x0) &&
       (0x57 < *(uint *)((long)local_28 + 0xc))) {
      return local_28[7];
    }
  }
  return 0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_evaluateSymbolBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(sysbvm_tuple_getType(context, environment) == context->roots.functionActivationEnvironmentType)
    {
        sysbvm_functionActivationEnvironment_t *activationEnvironment = (sysbvm_functionActivationEnvironment_t*)environment;
        sysbvm_symbolAnalysisBinding_t *analysisBinding = (sysbvm_symbolAnalysisBinding_t*)binding;
        if(analysisBinding->ownerFunction == activationEnvironment->functionDefinition || activationEnvironment->dependentFunctionType)
        {
            size_t vectorIndex = sysbvm_tuple_size_decode(analysisBinding->vectorIndex);
            sysbvm_tuple_t bindingType = sysbvm_tuple_getType(context, binding);
            if(bindingType == context->roots.symbolArgumentBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, vectorIndex);
            else if(bindingType == context->roots.symbolLocalBindingType)
                return sysbvm_array_at(activationEnvironment->valueVector, sysbvm_tuple_size_decode(activationEnvironment->argumentVectorSize) + vectorIndex);
            else if(bindingType == context->roots.symbolCaptureBindingType)
                return sysbvm_array_at(activationEnvironment->captureVector, vectorIndex);
            abort();
        }
    }

    sysbvm_tuple_t foundBinding = SYSBVM_NULL_TUPLE;
    if(!sysbvm_environment_lookSymbolRecursively(context, environment, sysbvm_symbolBinding_getName(binding), &foundBinding))
        sysbvm_error("Failed to evaluate analyzed symbol binding.");

    if(!sysbvm_symbolBinding_isValueQuick(context, foundBinding))
        sysbvm_error("A value binding in the evaluation context is required.");

    return sysbvm_symbolValueBinding_getValue(foundBinding);
}